

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qutil.cc
# Opt level: O3

void assert_hex_decode(string *input,string *expected)

{
  size_t __n;
  int iVar1;
  ostream *poVar2;
  _Alloc_hider _Var3;
  string actual;
  string local_38;
  
  QUtil::hex_decode(&local_38,input);
  _Var3._M_p = local_38._M_dataplus._M_p;
  __n = expected->_M_string_length;
  if (__n == local_38._M_string_length) {
    if (__n == 0) goto LAB_00122e2a;
    iVar1 = bcmp((expected->_M_dataplus)._M_p,local_38._M_dataplus._M_p,__n);
    if (iVar1 == 0) goto LAB_00122e2a;
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"hex encode ",0xb);
  poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)&std::cout,(input->_M_dataplus)._M_p,input->_M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,": expected = ",0xd);
  poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar2,(expected->_M_dataplus)._M_p,expected->_M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"; actual = ",0xb);
  poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar2,local_38._M_dataplus._M_p,local_38._M_string_length);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
  std::ostream::put((char)poVar2);
  std::ostream::flush();
  _Var3._M_p = local_38._M_dataplus._M_p;
LAB_00122e2a:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)_Var3._M_p != &local_38.field_2) {
    operator_delete(_Var3._M_p,local_38.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void
assert_hex_decode(std::string const& input, std::string const& expected)
{
    std::string actual = QUtil::hex_decode(input);
    if (expected != actual) {
        std::cout << "hex encode " << input << ": expected = " << expected
                  << "; actual = " << actual << std::endl;
    }
}